

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

CPAccessResult access_lor_ns(CPUARMState_conflict *env)

{
  CPAccessResult CVar1;
  uint64_t uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  
  uVar4 = (uint)env->features;
  if ((uVar4 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar3 = env->uncached_cpsr & 0x1f;
      if (uVar3 == 0x10) {
        uVar4 = 0;
      }
      else if (uVar3 == 0x16) {
        uVar4 = 3;
      }
      else if (uVar3 == 0x1a) {
        uVar4 = 2;
      }
      else {
        if ((env->features >> 0x21 & 1) != 0) {
          bVar5 = uVar3 == 0x16;
          if (!bVar5) {
            bVar5 = ((env->cp15).scr_el3 & 1) == 0;
          }
          if (((uVar4 >> 0x1c & 1) == 0) && (uVar4 = 3, bVar5)) goto LAB_006229e1;
        }
        uVar4 = 1;
      }
    }
    else {
      uVar4 = env->pstate >> 2 & 3;
    }
  }
  else {
    uVar4 = 1;
    if ((env->v7m).exception == 0) {
      uVar4 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
LAB_006229e1:
  if ((uVar4 < 2) && (uVar2 = arm_hcr_el2_eff_aarch64(env), (uVar2 >> 0x23 & 1) != 0)) {
    return CP_ACCESS_TRAP_EL2;
  }
  if ((2 < uVar4) || (CVar1 = CP_ACCESS_TRAP_EL3, ((env->cp15).scr_el3 & 0x4000) == 0)) {
    CVar1 = CP_ACCESS_OK;
  }
  return CVar1;
}

Assistant:

static CPAccessResult access_lor_ns(CPUARMState *env)
{
    int el = arm_current_el(env);

    if (el < 2 && (arm_hcr_el2_eff(env) & HCR_TLOR)) {
        return CP_ACCESS_TRAP_EL2;
    }
    if (el < 3 && (env->cp15.scr_el3 & SCR_TLOR)) {
        return CP_ACCESS_TRAP_EL3;
    }
    return CP_ACCESS_OK;
}